

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall
CLI::BadNameString::BadNameString(BadNameString *this,string *ename,string *msg,ExitCodes exit_code)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string
            (&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ename);
  ::std::__cxx11::string::string
            (&bStack_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  ConstructionError::ConstructionError
            (&this->super_ConstructionError,(string *)&local_48,(string *)&bStack_68,exit_code);
  ::std::__cxx11::string::~string((string *)&bStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ConstructionError).super_Error = &PTR__Error_004bc2e0;
  return;
}

Assistant:

static BadNameString OneCharName(std::string name) { return BadNameString("Invalid one char name: " + name); }